

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O3

AbstractionResult * __thiscall
Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>
          (AbstractionResult *__return_storage_ptr__,Kernel *this,TermSpec *au,TermSpec *t1)

{
  RationalConstantType *r;
  RobSubstitution *pRVar1;
  uint64_t uVar2;
  Term *this_00;
  UnificationConstraint *pUVar3;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar4;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *this_01;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:119:60),_Kernel::TermSpec>_>
  it;
  Stack<Kernel::TermSpec> *this_02;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
  *pDVar11;
  undefined8 uVar12;
  Self SVar13;
  undefined8 uVar14;
  bool bVar15;
  uint functor;
  uint functor_00;
  int iVar16;
  pointer __p;
  TermSpec *pTVar17;
  TermList TVar18;
  Stack<Kernel::TermSpec> *pSVar19;
  Entry *pEVar20;
  Stack<Kernel::UnificationConstraint> *pSVar21;
  UnificationConstraint *pUVar22;
  long lVar23;
  _Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  siglen;
  uchar *sig_00;
  Stack<Kernel::UnificationConstraint> *pSVar24;
  long lVar25;
  ulong uVar26;
  EVP_PKEY_CTX *ctx;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar27;
  EqualIf *this_03;
  uchar *tbs;
  long lVar28;
  ulong uVar29;
  Stack<Kernel::UnificationConstraint> *pSVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  TermSpec TVar34;
  TermSpec TVar35;
  TermSpec args;
  TermSpec args_1;
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_> sig;
  anon_class_56_7_29367afc curSumCanUnify;
  anon_class_16_2_625a7563 rest;
  RationalConstantType num;
  anon_class_8_1_3fcf64f2 cTerm;
  Numeral curSum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curNegSummands;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curPosSummands;
  anon_class_8_1_ba1d7831 constraint;
  anon_class_8_1_15ee404b equalIf;
  Option<unsigned_long> idx;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  constr;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  unify;
  anon_class_16_2_6c5ac959 toConstr;
  anon_class_16_2_0971476b sum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  _diff;
  undefined1 local_371 [9];
  undefined1 local_368 [23];
  undefined1 uStack_351;
  undefined7 uStack_350;
  undefined1 uStack_349;
  undefined7 uStack_348;
  undefined1 uStack_341;
  undefined7 uStack_340;
  undefined1 uStack_339;
  undefined7 uStack_338;
  undefined1 uStack_331;
  undefined1 local_328 [16];
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_318;
  undefined1 local_308 [39];
  uint64_t local_2e1;
  uint64_t uStack_2d9;
  UnificationConstraint local_2d0;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  AbstractingUnifier *local_298;
  Kernel *local_290;
  EqualIf local_288;
  __uniq_ptr_impl<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  local_268;
  __mpz_struct local_258;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_218;
  _Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> local_208;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_1f8;
  undefined1 local_1e8 [32];
  EqualIf local_1c8;
  undefined1 *local_1a8;
  Kernel ***local_1a0;
  TermSpec *local_198;
  undefined8 uStack_190;
  uint local_188;
  undefined4 uStack_184;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_180;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_170;
  EqualIf local_160;
  Kernel **local_140;
  undefined1 *local_138;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_130;
  EqualIf local_120;
  EqualIf local_100;
  EqualIf local_e0;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> local_c0;
  UnificationConstraint local_90;
  UnificationConstraint local_60;
  
  local_238._24_8_ = &local_2d0;
  local_2d0._t1.term._content._0_1_ = '\0';
  local_238._16_8_ = local_371;
  local_371._1_8_ = __return_storage_ptr__;
  local_290 = this;
  if (((au->term)._content & 3) == 0) {
    pRVar1 = *(RobSubstitution **)this;
    TVar34 = TermSpec::sort(au);
    local_368._0_7_ = (undefined7)TVar34.term._content;
    local_368[7] = TVar34.term._content._7_1_;
    local_368._8_4_ = TVar34.index;
    pTVar17 = RobSubstitution::derefBound(pRVar1,(TermSpec *)local_368);
    uVar29 = (pTVar17->term)._content;
    if ((uVar29 & 1) == 0) {
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b4bc80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      if (uVar29 != DAT_00b4bc80._content) goto LAB_005fdb7c;
    }
    else {
      iVar32 = pTVar17->index;
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b4bc80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      uVar26 = DAT_00b4bc80._content;
      local_368._0_7_ = (undefined7)DAT_00b4bc80._content;
      local_368[7] = (undefined1)(DAT_00b4bc80._content >> 0x38);
      if (((DAT_00b4bc80._content & 3) == 0) && ((*(byte *)(DAT_00b4bc80._content + 0x28) & 8) != 0)
         ) {
        TermList::ground((TermList *)local_368);
      }
      local_2d0._sort._8_8_ = AtomicSort::superSort();
      local_368._0_7_ = (undefined7)local_2d0._sort._8_8_;
      local_368[7] = (undefined1)((ulong)local_2d0._sort._8_8_ >> 0x38);
      if (((local_2d0._sort._8_8_ & 3) == 0) && ((*(byte *)(local_2d0._sort._8_8_ + 0x28) & 8) != 0)
         ) {
        TermList::ground((TermList *)local_368);
      }
      local_2d0._sort.term._content._0_4_ = 0;
      uStack_2a0 = 0;
      local_2d0._t1.term._content._0_1_ = '\x01';
      local_2d0._t1._8_8_ = uVar29;
      local_2d0._t2.term._content._0_4_ = iVar32;
      local_2d0._t2._8_8_ = uVar26;
    }
  }
  if (((t1->term)._content & 3) == 0) {
    pRVar1 = *(RobSubstitution **)this;
    TVar34 = TermSpec::sort(t1);
    local_368._0_7_ = (undefined7)TVar34.term._content;
    local_368[7] = TVar34.term._content._7_1_;
    local_368._8_4_ = TVar34.index;
    pTVar17 = RobSubstitution::derefBound(pRVar1,(TermSpec *)local_368);
    uVar29 = (pTVar17->term)._content;
    if ((uVar29 & 1) == 0) {
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b4bc80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      if (uVar29 != DAT_00b4bc80._content) {
LAB_005fdb7c:
        pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                     *)local_371._1_8_)->
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xf] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x11] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x12] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x13] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x14] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x15] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x16] = '\0';
        pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                     *)local_371._1_8_)->
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x17] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x18] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x19] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1a] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1b] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1c] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1d] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1e] = '\0';
        *(undefined8 *)
         &(((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             *)local_371._1_8_)->
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          ).
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             = 0;
        pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                     *)local_371._1_8_)->
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[7] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[8] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[9] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xb] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xc] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xd] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xe] = '\0';
        *(undefined4 *)
         ((((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             *)local_371._1_8_)->
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          ).
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ._content + 0x1f) = 0;
        return (AbstractionResult *)local_371._1_8_;
      }
    }
    else {
      iVar32 = pTVar17->index;
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b4bc80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      uVar26 = DAT_00b4bc80._content;
      local_368._0_7_ = (undefined7)DAT_00b4bc80._content;
      local_368[7] = (undefined1)(DAT_00b4bc80._content >> 0x38);
      if (((DAT_00b4bc80._content & 3) == 0) && ((*(byte *)(DAT_00b4bc80._content + 0x28) & 8) != 0)
         ) {
        TermList::ground((TermList *)local_368);
      }
      TVar18 = AtomicSort::superSort();
      local_368._0_7_ = (undefined7)TVar18._content;
      local_368[7] = (undefined1)(TVar18._content >> 0x38);
      if (((TVar18._content & 3) == 0) && ((*(byte *)(TVar18._content + 0x28) & 8) != 0)) {
        TermList::ground((TermList *)local_368);
      }
      local_2d0._sort.term._content._0_4_ = 0;
      uStack_2a0 = 0;
      local_2d0._t1.term._content._0_1_ = '\x01';
      local_2d0._t1._8_8_ = uVar29;
      local_2d0._t2.term._content._0_4_ = iVar32;
      local_2d0._t2._8_8_ = uVar26;
      local_2d0._sort._8_8_ = TVar18;
    }
  }
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_130);
  functor = NumTraits<Kernel::RationalConstantType>::addF();
  functor_00 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::minusF();
  uVar5 = au->term;
  uVar6 = au->index;
  TVar35.index = uVar6;
  TVar35.term._content = uVar5;
  TVar35._12_4_ = 0;
  TVar34 = RobSubstitution::createTerm<Kernel::TermSpec>
                     (*(RobSubstitution **)local_290,functor_00,TVar35);
  args._8_8_ = (AbstractingUnifier *)(TVar34._8_8_ & 0xffffffff);
  tbs = (uchar *)(t1->term)._content;
  uVar7 = t1->term;
  uVar8 = t1->index;
  args.term._content = TVar34.term._content._content;
  args_1._12_4_ = 0;
  args_1.term._content = uVar7;
  args_1.index = uVar8;
  uVar29 = (ulong)(uint)uVar8;
  TVar35 = RobSubstitution::createTerm<Kernel::TermSpec,Kernel::TermSpec>
                     (*(RobSubstitution **)local_290,functor,args,args_1);
  TVar34.term._content._4_4_ = 0;
  TVar34.term._content._0_4_ = TVar35.index;
  TVar34._8_8_ = this;
  TVar34 = norm((Kernel *)TVar35.term._content._content,TVar34,args._8_8_);
  iterAtoms<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1,auto:2)_2_>
            (TVar34.term._content._content,TVar34.index,this,
             local_130._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  pUVar22 = *(UnificationConstraint **)
             ((long)local_130._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                    ._M_head_impl + 8);
  lVar23 = (long)*(UnificationConstraint **)
                  ((long)local_130._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                         ._M_head_impl + 0x10) - (long)pUVar22 >> 4;
  pSVar21 = (Stack<Kernel::UnificationConstraint> *)0xffffffffffffffff;
  do {
    pSVar24 = (Stack<Kernel::UnificationConstraint> *)(lVar23 * -0x5555555555555555);
    if (lVar23 * 0x5555555555555555 + (long)pSVar21 == -1) break;
    pSVar24 = (Stack<Kernel::UnificationConstraint> *)((long)&pSVar21->_capacity + 1);
    pTVar17 = &pUVar22->_t1;
    pUVar22 = pUVar22 + 1;
    pSVar21 = pSVar24;
  } while (((pTVar17->term)._content & 1) != 0);
  local_140 = &local_290;
  local_1a0 = &local_140;
  local_1a8 = local_238 + 0x10;
  lVar23 = ((long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 0x10) -
            (long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 8) >> 4) * -0x5555555555555555;
  local_368._8_4_ = 0;
  local_368._12_4_ = 0;
  local_368._16_7_ = 0;
  uStack_351 = 0;
  uStack_350 = (undefined7)lVar23;
  uStack_349 = (undefined1)((ulong)lVar23 >> 0x38);
  local_368._0_7_ =
       local_130._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl._0_7_;
  local_368[7] = local_130._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                 .
                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                 ._M_head_impl._7_1_;
  local_138 = local_371;
  bVar15 = Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>,unsigned_long>(Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>&,unsigned_long)::{lambda(auto:1)#1},std::pair<Kernel::TermSpec,Kernel::RationalConstantType>&>>
           ::
           any<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1&)_2_>
                     ();
  if (bVar15) {
    if ((char)local_2d0._t1.term._content == '\x01') {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
      if ((char)local_2d0._t1.term._content == '\x01') {
        uStack_341 = (undefined1)local_2d0._sort.index;
        uStack_340 = local_2d0._sort._9_7_;
        uStack_339 = (undefined1)uStack_2a0;
        uStack_338 = (undefined7)(CONCAT44(uStack_29c,uStack_2a0) >> 8);
        uStack_351 = (undefined1)local_2d0._t2.index;
        uStack_350 = local_2d0._t2._9_7_;
        uStack_349 = (undefined1)(undefined4)local_2d0._sort.term._content;
        uStack_348 = (undefined7)
                     (CONCAT44(local_2d0._sort.term._content._4_4_,
                               (undefined4)local_2d0._sort.term._content) >> 8);
        local_368[7] = (undefined1)local_2d0._t1.index;
        local_368._8_4_ = local_2d0._t1._9_4_;
        local_368._12_3_ = local_2d0._t1._13_3_;
        local_368[0xf] = (undefined1)(int)local_2d0._t2.term._content;
        local_368._16_7_ =
             (undefined7)
             (CONCAT44(local_2d0._t2.term._content._4_4_,(int)local_2d0._t2.term._content) >> 8);
      }
      local_2d0._t1.term._content._0_1_ = '\0';
      pSVar21 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
      Lib::Stack<Kernel::UnificationConstraint>::reserve
                (pSVar21,((long)pSVar21->_cursor - (long)pSVar21->_stack >> 4) * -0x5555555555555555
                         + 1);
      pUVar22 = pSVar21->_cursor;
      if (pUVar22 == pSVar21->_end) {
        Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar21);
        pUVar22 = pSVar21->_cursor;
      }
      (pUVar22->_sort).term._content = CONCAT71(uStack_340,uStack_341);
      *(ulong *)&(pUVar22->_sort).index = CONCAT71(uStack_338,uStack_339);
      (pUVar22->_t2).term._content = CONCAT71(uStack_350,uStack_351);
      *(ulong *)&(pUVar22->_t2).index = CONCAT71(uStack_348,uStack_349);
      (pUVar22->_t1).term._content =
           CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]));
      *(ulong *)&(pUVar22->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
      pSVar21->_cursor = pSVar21->_cursor + 1;
      local_328[7] = local_308[7];
      local_328._0_7_ = local_308._0_7_;
      local_318._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._7_1_
           = local_308[0x17];
      local_318._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_7_
           = local_308._16_7_;
      local_308._0_7_ = 0;
      local_308[7] = 0;
      local_308._16_7_ = 0;
      local_308[0x17] = 0;
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)(local_308 + 0x10));
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)local_308);
    }
    else {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
    }
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
    ::{lambda(auto:1&)#1}::operator()
              (&local_60,(_lambda_auto_1___1_ *)&local_1a8,
               (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               local_130._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    SVar13._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )local_318._self;
    uStack_348 = (undefined7)local_60._sort.term._content;
    uStack_341 = (undefined1)(local_60._sort.term._content >> 0x38);
    uStack_340 = local_60._sort._8_7_;
    uStack_339 = local_60._sort._15_1_;
    local_368._16_7_ = (undefined7)local_60._t2.term._content;
    uStack_351 = (undefined1)(local_60._t2.term._content >> 0x38);
    uStack_350 = local_60._t2._8_7_;
    uStack_349 = local_60._t2._15_1_;
    local_368._0_7_ = (undefined7)local_60._t1.term._content;
    local_368[7] = (undefined1)(local_60._t1.term._content >> 0x38);
    local_368._8_4_ = local_60._t1.index;
    local_368._12_4_ = local_60._t1._12_4_;
    Lib::Stack<Kernel::UnificationConstraint>::reserve
              ((Stack<Kernel::UnificationConstraint> *)
               local_318._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
               _M_head_impl,
               ((long)*(UnificationConstraint **)
                       ((long)local_318._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                              ._M_head_impl + 0x10) -
                (long)*(UnificationConstraint **)
                       ((long)local_318._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                              ._M_head_impl + 8) >> 4) * -0x5555555555555555 + 1);
    pUVar22 = *(UnificationConstraint **)
               ((long)SVar13._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                      _M_head_impl + 0x10);
    if (pUVar22 ==
        *(UnificationConstraint **)
         ((long)SVar13._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                _M_head_impl + 0x18)) {
      Lib::Stack<Kernel::UnificationConstraint>::expand
                ((Stack<Kernel::UnificationConstraint> *)
                 SVar13._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                 _M_head_impl);
      pUVar22 = *(UnificationConstraint **)
                 ((long)SVar13._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                        _M_head_impl + 0x10);
    }
    (pUVar22->_sort).term._content = CONCAT17(uStack_341,uStack_348);
    *(ulong *)&(pUVar22->_sort).index = CONCAT17(uStack_339,uStack_340);
    (pUVar22->_t2).term._content = CONCAT17(uStack_351,local_368._16_7_);
    *(ulong *)&(pUVar22->_t2).index = CONCAT17(uStack_349,uStack_350);
    (pUVar22->_t1).term._content = CONCAT17(local_368[7],local_368._0_7_);
    *(ulong *)&(pUVar22->_t1).index = CONCAT44(local_368._12_4_,local_368._8_4_);
    *(UnificationConstraint **)
     ((long)SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
     + 0x10) = *(UnificationConstraint **)
                ((long)SVar13._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                       _M_head_impl + 0x10) + 1;
    local_e0._unify._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )local_328._0_8_;
    local_328._0_8_ =
         (__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          )0x0;
    local_e0._constr._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         local_318._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
    local_318._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            )0x0;
    Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
              ((Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                *)local_371._1_8_,&local_e0);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_e0._constr);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_e0._unify);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_318);
    this_03 = (EqualIf *)local_328;
  }
  else if (*(UnificationConstraint **)
            ((long)local_130._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                   ._M_head_impl + 0x10) ==
           *(UnificationConstraint **)
            ((long)local_130._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                   ._M_head_impl + 8)) {
    if ((char)local_2d0._t1.term._content == '\x01') {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
      if ((char)local_2d0._t1.term._content == '\x01') {
        uStack_341 = (undefined1)local_2d0._sort.index;
        uStack_340 = local_2d0._sort._9_7_;
        uStack_339 = (undefined1)uStack_2a0;
        uStack_338 = (undefined7)(CONCAT44(uStack_29c,uStack_2a0) >> 8);
        uStack_351 = (undefined1)local_2d0._t2.index;
        uStack_350 = local_2d0._t2._9_7_;
        uStack_349 = (undefined1)(undefined4)local_2d0._sort.term._content;
        uStack_348 = (undefined7)
                     (CONCAT44(local_2d0._sort.term._content._4_4_,
                               (undefined4)local_2d0._sort.term._content) >> 8);
        local_368[7] = (undefined1)local_2d0._t1.index;
        local_368._8_4_ = local_2d0._t1._9_4_;
        local_368._12_3_ = local_2d0._t1._13_3_;
        local_368[0xf] = (undefined1)(int)local_2d0._t2.term._content;
        local_368._16_7_ =
             (undefined7)
             (CONCAT44(local_2d0._t2.term._content._4_4_,(int)local_2d0._t2.term._content) >> 8);
      }
      local_2d0._t1.term._content._0_1_ = '\0';
      pSVar21 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
      Lib::Stack<Kernel::UnificationConstraint>::reserve
                (pSVar21,((long)pSVar21->_cursor - (long)pSVar21->_stack >> 4) * -0x5555555555555555
                         + 1);
      pUVar22 = pSVar21->_cursor;
      if (pUVar22 == pSVar21->_end) {
        Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar21);
        pUVar22 = pSVar21->_cursor;
      }
      (pUVar22->_sort).term._content = CONCAT71(uStack_340,uStack_341);
      *(ulong *)&(pUVar22->_sort).index = CONCAT71(uStack_338,uStack_339);
      (pUVar22->_t2).term._content = CONCAT71(uStack_350,uStack_351);
      *(ulong *)&(pUVar22->_t2).index = CONCAT71(uStack_348,uStack_349);
      (pUVar22->_t1).term._content =
           CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]));
      *(ulong *)&(pUVar22->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
      pSVar21->_cursor = pSVar21->_cursor + 1;
      local_308._0_7_ = 0;
      local_308[7] = 0;
      local_308._16_7_ = 0;
      local_308[0x17] = 0;
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)(local_308 + 0x10));
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)local_308);
    }
    else {
      AbstractionOracle::EqualIf::EqualIf(&local_1c8);
    }
    Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
              ((Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                *)local_371._1_8_,&local_1c8);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_1c8._constr);
    this_03 = &local_1c8;
  }
  else {
    local_298 = (AbstractingUnifier *)this;
    if (pSVar24 != (Stack<Kernel::UnificationConstraint> *)0x0) {
      Lib::
      Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&local_268);
      local_1e8._16_8_ =
           ((long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 0x10) -
            (long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 8) >> 4) * -0x5555555555555555;
      if (pSVar24 < (ulong)local_1e8._16_8_) {
        pSVar21 = (Stack<Kernel::UnificationConstraint> *)((long)&pSVar24->_capacity + 1);
        pSVar30 = pSVar24;
        do {
          local_1e8._24_8_ = pSVar21;
          Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)local_368);
          this_02 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
          uVar2 = (*(UnificationConstraint **)
                    ((long)local_130._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                           ._M_head_impl + 8))[(long)pSVar30]._t1.term._content;
          iVar32 = (*(UnificationConstraint **)
                     ((long)local_130._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                            ._M_head_impl + 8))[(long)pSVar30]._t1.index;
          pTVar17 = this_02->_cursor;
          pSVar19 = this_02;
          if (pTVar17 == this_02->_end) {
            Lib::Stack<Kernel::TermSpec>::expand(this_02);
            pTVar17 = this_02->_cursor;
            pSVar19 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
          }
          (pTVar17->term)._content = uVar2;
          pTVar17->index = iVar32;
          this_02->_cursor = pTVar17 + 1;
          pTVar17 = pSVar19->_cursor;
          if (pTVar17 != pSVar19->_stack) {
            do {
              pSVar19->_cursor = pTVar17 + -1;
              uVar2 = pTVar17[-1].term._content;
              local_308._8_4_ = pTVar17[-1].index;
              local_308._0_7_ = (undefined7)uVar2;
              local_308[7] = (undefined1)(uVar2 >> 0x38);
              pTVar17 = RobSubstitution::derefBound
                                  ((RobSubstitution *)
                                   (local_298->_subs)._self._M_t.
                                   super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                                   .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,
                                   (TermSpec *)local_308);
              this_00 = (Term *)(pTVar17->term)._content;
              if (((ulong)this_00 & 1) == 0) {
                pSVar19 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
                local_188 = Term::numTermArguments(this_00);
                uStack_190 = 0;
                it._iter._20_4_ = uStack_184;
                it._iter._inner._to = local_188;
                it._iter._inner._next = 0;
                it._iter._inner._from = 0;
                it._iter._func.this = pTVar17;
                local_198 = pTVar17;
                Lib::Stack<Kernel::TermSpec>::
                loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::termArgs()const::_lambda(auto:1)_1_,Kernel::TermSpec>>>
                          (pSVar19,it);
              }
              else {
                Lib::DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert((DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_268._M_t.
                            super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            .
                            super__Head_base<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                            ._M_head_impl,this_00,pTVar17->index);
              }
              pSVar19 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
              pTVar17 = pSVar19->_cursor;
            } while (pTVar17 != pSVar19->_stack);
          }
          Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          ~Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)local_368);
          pSVar21 = (Stack<Kernel::UnificationConstraint> *)
                    ((long)(size_t *)local_1e8._24_8_ +
                    (ulong)((ulong)local_1e8._24_8_ < (ulong)local_1e8._16_8_));
          pSVar30 = (Stack<Kernel::UnificationConstraint> *)local_1e8._24_8_;
        } while ((ulong)local_1e8._24_8_ < (ulong)local_1e8._16_8_);
      }
      lVar33 = 0x10;
      lVar25 = 0x20;
      lVar23 = 0x30;
      lVar28 = 1;
      lVar31 = 0;
      do {
        if ((long)&pSVar24->_capacity + lVar28 == 1) {
          local_218._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  )0x0;
          local_218._8_8_ = 0;
          if (pSVar24 != (Stack<Kernel::UnificationConstraint> *)0x1) goto LAB_005fe75d;
          pUVar22 = *(UnificationConstraint **)
                     ((long)local_130._self._M_t.
                            super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                            .
                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                            ._M_head_impl + 8);
          IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_368,(IntegerConstantType *)&pUVar22->_t2);
          IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)(local_368 + 0x10),
                     (IntegerConstantType *)&pUVar22->_sort);
          uVar29 = ((long)*(UnificationConstraint **)
                           ((long)local_130._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 0x10) -
                    (long)*(UnificationConstraint **)
                           ((long)local_130._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 8) >> 4) * -0x5555555555555555;
          if (uVar29 < 2) goto LAB_005fe73c;
          lVar23 = 0x30;
          uVar26 = 2;
          goto LAB_005fe6f3;
        }
        pEVar20 = Lib::
                  DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  findEntry((DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                             *)local_268._M_t.
                               super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                               .
                               super__Head_base<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                               ._M_head_impl,
                            (TermSpec *)
                            ((long)&((*(UnificationConstraint **)
                                       ((long)local_130._self._M_t.
                                              super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                              .
                                              super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                              ._M_head_impl + 8))->_t1).term._content + lVar31));
        lVar33 = lVar33 + -0x30;
        lVar25 = lVar25 + -0x30;
        lVar23 = lVar23 + -0x30;
        lVar28 = lVar28 + -1;
        lVar31 = lVar31 + 0x30;
      } while (pEVar20 != (Entry *)0x0);
      local_218._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_1_
           = 1;
      local_218._8_8_ = -lVar28;
      pUVar22 = *(UnificationConstraint **)
                 ((long)local_130._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                        ._M_head_impl + 8);
      IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)local_308,(IntegerConstantType *)((long)pUVar22 - lVar25));
      IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)(local_308 + 0x10),
                 (IntegerConstantType *)((long)pUVar22 - lVar33));
      lVar23 = (long)*(UnificationConstraint **)
                      ((long)local_130._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                             ._M_head_impl + 8) - lVar23;
      local_328._0_8_ =
           local_130._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
           ._M_head_impl;
      local_328._8_8_ = &local_218;
      local_368._0_7_ = SUB87((IntegerConstantType *)local_308,0);
      local_368[7] = (undefined1)((ulong)local_308 >> 0x38);
      local_368._8_8_ = local_238 + 0x18;
      local_368._16_7_ = SUB87(local_238 + 0x10,0);
      uStack_351 = (undefined1)((ulong)(local_238 + 0x10) >> 0x38);
      uStack_350 = (undefined7)lVar23;
      uStack_349 = (undefined1)((ulong)lVar23 >> 0x38);
      uStack_348 = SUB87(&local_140,0);
      uStack_341 = (undefined1)((ulong)&local_140 >> 0x38);
      uStack_340 = SUB87(local_328,0);
      uStack_339 = (undefined1)((ulong)local_328 >> 0x38);
      alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
      ::{lambda(auto:1)#5}::operator()(&local_160);
      Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
      Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                ((Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                  *)local_371._1_8_,&local_160);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_160._constr);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_160._unify);
      mpz_clear((__mpz_struct *)(local_308 + 0x10));
      mpz_clear((__mpz_struct *)local_308);
      goto LAB_005fe9a9;
    }
    siglen._M_head_impl =
         (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)local_130._self;
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)local_1e8);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&local_1f8);
    iVar32 = *(int *)(((*(UnificationConstraint **)
                         ((long)local_130._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                ._M_head_impl + 8))->_t1).term._content + 8);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)local_238);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)local_248);
    RationalConstantType::RationalConstantType((RationalConstantType *)&local_268,0);
    local_368._0_7_ = SUB87((RationalConstantType *)&local_268,0);
    local_368[7] = (undefined1)((ulong)&local_268 >> 0x38);
    local_368._8_8_ = local_248;
    local_368._16_7_ = SUB87(local_238,0);
    uStack_351 = (undefined1)((ulong)local_238 >> 0x38);
    uStack_350 = SUB87((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)local_1e8,0);
    uStack_349 = (undefined1)((ulong)local_1e8 >> 0x38);
    uStack_348 = SUB87(local_371,0);
    uStack_341 = (undefined1)((ulong)local_371 >> 0x38);
    uStack_340 = SUB87(&local_1f8,0);
    uStack_339 = (undefined1)((ulong)&local_1f8 >> 0x38);
    uStack_338 = SUB87(&local_140,0);
    uStack_331 = (undefined1)((ulong)&local_140 >> 0x38);
    pUVar22 = *(UnificationConstraint **)
               ((long)local_130._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                      .
                      super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                      ._M_head_impl + 8);
    pUVar3 = *(UnificationConstraint **)
              ((long)local_130._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl + 0x10);
    if (pUVar22 != pUVar3) {
      do {
        pTVar17 = RobSubstitution::derefBound
                            ((RobSubstitution *)
                             (local_298->_subs)._self._M_t.
                             super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                             .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,&pUVar22->_t1)
        ;
        iVar16 = *(int *)((pTVar17->term)._content + 8);
        if (iVar16 != iVar32) {
          bVar15 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::
                   anon_class_56_7_29367afc::operator()((anon_class_56_7_29367afc *)local_368);
          if (!bVar15) goto LAB_005fe881;
          RationalConstantType::RationalConstantType((RationalConstantType *)local_308,0);
          mpz_swap((__mpz_struct *)&local_268,(__mpz_struct *)local_308);
          mpz_swap(&local_258,(__mpz_struct *)(local_308 + 0x10));
          mpz_clear((__mpz_struct *)(local_308 + 0x10));
          mpz_clear((__mpz_struct *)local_308);
          uVar14 = local_238._0_8_;
          for (ppVar27 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                          (local_238._0_8_ + 0x10); uVar12 = local_248._0_8_,
              ppVar4 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)(uVar14 + 8),
              ppVar27 != ppVar4; ppVar27 = ppVar27 + -1) {
            mpz_clear(ppVar27[-1].second._den._val);
            mpz_clear((__mpz_struct *)&ppVar27[-1].second);
          }
          *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)(uVar14 + 0x10) = ppVar4;
          for (ppVar27 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                          (local_248._0_8_ + 0x10);
              ppVar4 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)(uVar12 + 8),
              ppVar27 != ppVar4; ppVar27 = ppVar27 + -1) {
            mpz_clear(ppVar27[-1].second._den._val);
            mpz_clear((__mpz_struct *)&ppVar27[-1].second);
          }
          *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)(uVar12 + 0x10) = ppVar4;
          iVar32 = iVar16;
        }
        r = (RationalConstantType *)&pUVar22->_t2;
        ctx = (EVP_PKEY_CTX *)r;
        RationalConstantType::operator+=((RationalConstantType *)&local_268,r);
        iVar16 = RationalConstantType::sign
                           (r,ctx,sig_00,&(siglen._M_head_impl)->_capacity,tbs,uVar29);
        siglen._M_head_impl =
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)local_238;
        pSVar21 = (Stack<Kernel::UnificationConstraint> *)local_248;
        if ((char)iVar16 == '\x01') {
          pSVar21 = (Stack<Kernel::UnificationConstraint> *)siglen._M_head_impl;
        }
        this_01 = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                  pSVar21->_capacity;
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair
                  (&local_c0,(pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)pUVar22);
        ppVar27 = this_01->_cursor;
        if (ppVar27 == this_01->_end) {
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::expand(this_01);
          ppVar27 = this_01->_cursor;
        }
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair(ppVar27,&local_c0);
        this_01->_cursor = this_01->_cursor + 1;
        mpz_clear(local_c0.second._den._val);
        mpz_clear((__mpz_struct *)&local_c0.second);
        pUVar22 = pUVar22 + 1;
      } while (pUVar22 != pUVar3);
    }
    bVar15 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc::
             operator()((anon_class_56_7_29367afc *)local_368);
    uVar14 = local_238._24_8_;
    if (bVar15) {
      if ((char)(((TermSpec *)local_238._24_8_)->term)._content == '\x01') {
        AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
        uVar12 = local_328._0_8_;
        if ((char)(((TermSpec *)uVar14)->term)._content == '\x01') {
          uVar9 = *(undefined8 *)&((TermSpec *)uVar14)->index;
          uVar2 = (((TermSpec *)(uVar14 + 0x10))->term)._content;
          uVar10 = *(undefined8 *)&((TermSpec *)(uVar14 + 0x10))->index;
          local_308._31_8_ = (((TermSpec *)(uVar14 + 0x20))->term)._content;
          local_2e1 = *(uint64_t *)&((TermSpec *)(uVar14 + 0x20))->index;
          uStack_2d9 = (((UnificationConstraint *)(uVar14 + 0x30))->_t1).term._content;
          local_308[0x17] = (undefined1)uVar10;
          local_308._24_7_ = (undefined7)((ulong)uVar10 >> 8);
          local_308[7] = (undefined1)uVar9;
          local_308._8_4_ = (undefined4)((ulong)uVar9 >> 8);
          local_308._12_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_308[0xf] = (undefined1)uVar2;
          local_308._16_7_ = (undefined7)(uVar2 >> 8);
        }
        *(undefined1 *)&(((TermSpec *)uVar14)->term)._content = 0;
        Lib::Stack<Kernel::UnificationConstraint>::reserve
                  ((Stack<Kernel::UnificationConstraint> *)local_328._0_8_,
                   ((long)*(UnificationConstraint **)(local_328._0_8_ + 0x10) -
                    (long)*(UnificationConstraint **)(local_328._0_8_ + 8) >> 4) *
                   -0x5555555555555555 + 1);
        pUVar22 = *(UnificationConstraint **)(uVar12 + 0x10);
        if (pUVar22 == *(UnificationConstraint **)(uVar12 + 0x18)) {
          Lib::Stack<Kernel::UnificationConstraint>::expand
                    ((Stack<Kernel::UnificationConstraint> *)uVar12);
          pUVar22 = *(UnificationConstraint **)(uVar12 + 0x10);
        }
        (pUVar22->_sort).term._content = local_2e1;
        *(uint64_t *)&(pUVar22->_sort).index = uStack_2d9;
        (pUVar22->_t2).term._content = CONCAT71(local_308._24_7_,local_308[0x17]);
        *(undefined8 *)&(pUVar22->_t2).index = local_308._31_8_;
        (pUVar22->_t1).term._content =
             CONCAT35(local_308._12_3_,CONCAT41(local_308._8_4_,local_308[7]));
        *(ulong *)&(pUVar22->_t1).index = CONCAT71(local_308._16_7_,local_308[0xf]);
        *(UnificationConstraint **)(uVar12 + 0x10) = *(UnificationConstraint **)(uVar12 + 0x10) + 1;
        local_288._unify._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_328._0_8_;
        local_328._0_8_ =
             (__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
        local_288._constr._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             local_318._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
        ;
        local_318._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                )0x0;
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_318);
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)local_328);
      }
      else {
        AbstractionOracle::EqualIf::EqualIf(&local_288);
      }
      local_218._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_1e8._0_8_;
      SVar13._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_288._unify._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      local_1e8._0_8_ = (Stack<Kernel::UnificationConstraint> *)0x0;
      local_170._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_288._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_218._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      if ((tuple<Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           )SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
          != (_Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>)0x0) {
        std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>::operator()
                  ((default_delete<Lib::Stack<Kernel::UnificationConstraint>_> *)&local_288,
                   (Stack<Kernel::UnificationConstraint> *)
                   SVar13._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl);
        local_218._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_288._unify._self;
      }
      local_208._M_head_impl = (Stack<Kernel::UnificationConstraint> *)local_1f8._self;
      SVar13._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_288._constr._self;
      local_288._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_288._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_1f8._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_180._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_120._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_218._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      local_120._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_208._M_head_impl;
      if ((_Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           )SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
          != (Stack<Kernel::UnificationConstraint> *)0x0) {
        std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>::operator()
                  ((default_delete<Lib::Stack<Kernel::UnificationConstraint>_> *)&local_208,
                   (Stack<Kernel::UnificationConstraint> *)
                   SVar13._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl);
        local_120._unify._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_218._self;
        local_120._constr._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_208;
      }
      local_218._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_208._M_head_impl = (Stack<Kernel::UnificationConstraint> *)0x0;
      Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
      Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                ((Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                  *)local_371._1_8_,&local_120);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_120._constr);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_120._unify);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_180);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&local_208);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_218);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_170);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_288._constr);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_288._unify);
    }
    else {
LAB_005fe881:
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xf] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x11] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x12] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x13] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x14] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x15] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x16] = '\0';
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x17] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x18] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x19] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1a] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1b] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1c] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1d] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1e] = '\0';
      *(undefined8 *)
       &(((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *)local_371._1_8_)->
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ).
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           = 0;
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[7] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[8] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[9] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xb] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xc] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xd] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xe] = '\0';
      *(undefined4 *)
       ((((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *)local_371._1_8_)->
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ).
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        ._content + 0x1f) = 0;
    }
    mpz_clear(&local_258);
    mpz_clear((__mpz_struct *)&local_268);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_248);
    Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_238);
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_1f8);
    this_03 = (EqualIf *)local_1e8;
  }
  Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&this_03->_unify);
  goto LAB_005feb4c;
  while( true ) {
    lVar23 = lVar23 + 0x30;
    bVar15 = uVar29 <= uVar26;
    uVar26 = uVar26 + 1;
    if (bVar15) break;
LAB_005fe6f3:
    uVar2 = (pUVar22->_t1).term._content;
    local_308._8_4_ = (pUVar22->_t1).index;
    local_308._0_7_ = (undefined7)uVar2;
    local_308[7] = (undefined1)(uVar2 >> 0x38);
    bVar15 = uncanellableOccursCheck
                       (local_298,(VarSpec *)local_308,
                        (TermSpec *)
                        ((long)&((*(UnificationConstraint **)
                                   ((long)local_130._self._M_t.
                                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                          .
                                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                          ._M_head_impl + 8))->_t1).term._content + lVar23));
    if (bVar15) {
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xf] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x11] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x12] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x13] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x14] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x15] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x16] = '\0';
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x17] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x18] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x19] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1a] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1b] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1c] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1d] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1e] = '\0';
      *(undefined8 *)
       &(((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *)local_371._1_8_)->
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ).
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           = 0;
      pDVar11 = &((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)local_371._1_8_)->
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[7] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[8] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[9] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xb] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xc] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xd] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xe] = '\0';
      *(undefined4 *)
       ((((RawWithDefaultImpls<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *)local_371._1_8_)->
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ).
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        ._content + 0x1f) = 0;
      RationalConstantType::~RationalConstantType((RationalConstantType *)local_368);
      goto LAB_005fe9a9;
    }
  }
LAB_005fe73c:
  mpz_clear((__mpz_struct *)(local_368 + 0x10));
  mpz_clear((__mpz_struct *)local_368);
LAB_005fe75d:
  if ((char)local_2d0._t1.term._content == '\x01') {
    AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
    if ((char)local_2d0._t1.term._content == '\x01') {
      uStack_341 = (undefined1)local_2d0._sort.index;
      uStack_340 = local_2d0._sort._9_7_;
      uStack_339 = (undefined1)uStack_2a0;
      uStack_338 = (undefined7)(CONCAT44(uStack_29c,uStack_2a0) >> 8);
      uStack_351 = (undefined1)local_2d0._t2.index;
      uStack_350 = local_2d0._t2._9_7_;
      uStack_349 = (undefined1)(undefined4)local_2d0._sort.term._content;
      uStack_348 = (undefined7)
                   (CONCAT44(local_2d0._sort.term._content._4_4_,
                             (undefined4)local_2d0._sort.term._content) >> 8);
      local_368[7] = (undefined1)local_2d0._t1.index;
      local_368._8_4_ = local_2d0._t1._9_4_;
      local_368._12_3_ = local_2d0._t1._13_3_;
      local_368[0xf] = (undefined1)(int)local_2d0._t2.term._content;
      local_368._16_7_ =
           (undefined7)
           (CONCAT44(local_2d0._t2.term._content._4_4_,(int)local_2d0._t2.term._content) >> 8);
    }
    local_2d0._t1.term._content._0_1_ = '\0';
    pSVar21 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
    Lib::Stack<Kernel::UnificationConstraint>::reserve
              (pSVar21,((long)pSVar21->_cursor - (long)pSVar21->_stack >> 4) * -0x5555555555555555 +
                       1);
    pUVar22 = pSVar21->_cursor;
    if (pUVar22 == pSVar21->_end) {
      Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar21);
      pUVar22 = pSVar21->_cursor;
    }
    (pUVar22->_sort).term._content = CONCAT71(uStack_340,uStack_341);
    *(ulong *)&(pUVar22->_sort).index = CONCAT71(uStack_338,uStack_339);
    (pUVar22->_t2).term._content = CONCAT71(uStack_350,uStack_351);
    *(ulong *)&(pUVar22->_t2).index = CONCAT71(uStack_348,uStack_349);
    (pUVar22->_t1).term._content = CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]))
    ;
    *(ulong *)&(pUVar22->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
    pSVar21->_cursor = pSVar21->_cursor + 1;
    local_328[7] = local_308[7];
    local_328._0_7_ = local_308._0_7_;
    local_318._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._7_1_ =
         local_308[0x17];
    local_318._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_7_ =
         local_308._16_7_;
    local_308._0_7_ = 0;
    local_308[7] = 0;
    local_308._16_7_ = 0;
    local_308[0x17] = 0;
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)(local_308 + 0x10));
    Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_308);
  }
  else {
    AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
  }
  alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
  ::{lambda(auto:1&)#1}::operator()
            (&local_90,(_lambda_auto_1___1_ *)&local_1a8,
             (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
             local_130._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  SVar13._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
       local_318._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
       .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
  uStack_348 = (undefined7)local_90._sort.term._content;
  uStack_341 = (undefined1)(local_90._sort.term._content >> 0x38);
  uStack_340 = local_90._sort._8_7_;
  uStack_339 = local_90._sort._15_1_;
  local_368._16_7_ = (undefined7)local_90._t2.term._content;
  uStack_351 = (undefined1)(local_90._t2.term._content >> 0x38);
  uStack_350 = local_90._t2._8_7_;
  uStack_349 = local_90._t2._15_1_;
  local_368._0_7_ = (undefined7)local_90._t1.term._content;
  local_368[7] = (undefined1)(local_90._t1.term._content >> 0x38);
  local_368._8_4_ = local_90._t1.index;
  local_368._12_4_ = local_90._t1._12_4_;
  Lib::Stack<Kernel::UnificationConstraint>::reserve
            ((Stack<Kernel::UnificationConstraint> *)
             local_318._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
             ,((long)*(UnificationConstraint **)
                      ((long)local_318._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                             ._M_head_impl + 0x10) -
               (long)*(UnificationConstraint **)
                      ((long)local_318._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                             .
                             super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                             ._M_head_impl + 8) >> 4) * -0x5555555555555555 + 1);
  pUVar22 = *(UnificationConstraint **)
             ((long)SVar13._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                    _M_head_impl + 0x10);
  if (pUVar22 ==
      *(UnificationConstraint **)
       ((long)SVar13._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
              _M_head_impl + 0x18)) {
    Lib::Stack<Kernel::UnificationConstraint>::expand
              ((Stack<Kernel::UnificationConstraint> *)
               SVar13._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
               _M_head_impl);
    pUVar22 = *(UnificationConstraint **)
               ((long)SVar13._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                      _M_head_impl + 0x10);
  }
  (pUVar22->_sort).term._content = CONCAT17(uStack_341,uStack_348);
  *(ulong *)&(pUVar22->_sort).index = CONCAT17(uStack_339,uStack_340);
  (pUVar22->_t2).term._content = CONCAT17(uStack_351,local_368._16_7_);
  *(ulong *)&(pUVar22->_t2).index = CONCAT17(uStack_349,uStack_350);
  (pUVar22->_t1).term._content = CONCAT17(local_368[7],local_368._0_7_);
  *(ulong *)&(pUVar22->_t1).index = CONCAT44(local_368._12_4_,local_368._8_4_);
  *(UnificationConstraint **)
   ((long)SVar13._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl +
   0x10) = *(UnificationConstraint **)
            ((long)SVar13._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl + 0x10) + 1;
  local_100._unify._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
        )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )local_328._0_8_;
  local_328._0_8_ =
       (__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        )0x0;
  local_100._constr._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
       local_318._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
       .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
  local_318._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
        )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          )0x0;
  Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
  Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
            ((Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf> *
             )local_371._1_8_,&local_100);
  Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_100._constr);
  Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_100._unify);
  Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_318);
  Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             *)local_328);
LAB_005fe9a9:
  Lib::
  Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)&local_268);
LAB_005feb4c:
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_130);
  return (AbstractionResult *)local_371._1_8_;
}

Assistant:

AbstractionOracle::AbstractionResult alasca(AbstractingUnifier& au, TermSpec const& t1, TermSpec const& t2, NumTraits n_, Options::UnificationWithAbstraction uwa) {
  TIME_TRACE("unification with abstraction ALASCA")
  AlascaSignature<NumTraits> sig;
  Option<UnificationConstraint> sortsUnif;
  auto equalIf = [&]() {
    if (sortsUnif.isSome()) {
      return AbstractionOracle::EqualIf()
                     .unify(*sortsUnif.take());
    } else {
      return AbstractionOracle::EqualIf();
    }
  };
  using AbstractionResult = AbstractionOracle::AbstractionResult;
  using NeverEqual = AbstractionOracle::NeverEqual;
  using Numeral = typename NumTraits::ConstantType;
  
  auto cTerm = [&](auto... args) { return au.subs().createTerm(args...); };
  auto constraint = [&](auto lhs, auto rhs) { return UnificationConstraint(lhs, rhs, TermSpec(sig.sort(), 0)); };

#define CHECK_SORTS(t1, t2)                                                               \
  if (t1.isTerm()) {                                                                      \
    auto s1 = au.subs().derefBound(t1.sort());                                            \
    if (s1.isVar()) {                                                                     \
      ASS(sortsUnif.isNone())                                                             \
      sortsUnif = some(UnificationConstraint(s1, TermSpec(sig.sort(), 0), TermSpec(AtomicSort::superSort(), 0))); \
    } else if (s1.term != sig.sort()) {                                                   \
      return AbstractionResult(NeverEqual{});                                             \
    }                                                                                     \
  }                                                                                       \

  CHECK_SORTS(t1, t2)
  CHECK_SORTS(t2, t1)

  Recycled<Stack<std::pair<TermSpec, Numeral>>> _diff;
  auto& diff = *_diff;
  // TODO prevent these cterm calls?
  auto dt = cTerm(sig.addF(), cTerm(sig.minusF(), t1), t2);
  auto nf = norm(std::move(dt), au);

  iterAtoms(std::move(nf), au, sig,
    [&diff](auto t, auto num) { diff.push(std::make_pair(t,  num)); });

  // TODO bin search if many elems
  auto nVars = range(0, diff.size())
    .find([&](auto i) { return !diff[i].first.isVar();  })
    .unwrapOrElse([&](){ return diff.size(); });

  ASS(nVars == 0 || diff[nVars - 1].first.isVar())
  ASS(nVars == diff.size() || !diff[nVars].first.isVar())

  auto sum = [&](auto iter) -> TermSpec {
      return iterTraits(std::move(iter))
        .map([&](auto x) { return numMul(x.second, std::move(x.first)); })
        .fold([&](auto l, auto r) 
          { return cTerm(sig.addF(), std::move(l), std::move(r)); })
        .unwrapOrElse([&]() { return TermSpec(sig.numeralTl(Numeral(0)), 0); }); };

  auto toConstr = [&](auto& stack) {
    return constraint(
              sum(arrayIter(stack)
                 .filter([](auto& x) { return x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(std::move(x.first)), x.second); })),
              sum(arrayIter(stack)
                 .filter([](auto& x) { return !x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })));
  };

  if (arrayIter(diff).any([&](auto& x) 
        { return x.first.isTerm() && NumTraits::isMul(x.first.functor()); })) {

    // non-linear multiplication. we cannot deal with this in alasca
    return AbstractionResult(equalIf().constr(toConstr(diff)));

  } else if (diff.size() == 0) {
    return AbstractionResult(equalIf());

  } else if (nVars > 0) {
     Recycled<DHSet<TermSpec>> shieldedVars;
     for (auto i : range(nVars, diff.size())) {
       Recycled<Stack<TermSpec>> todo;
       todo->push(diff[i].first);
       while (todo->isNonEmpty()) {
         auto next_ = todo->pop();
         auto& next = au.subs().derefBound(next_);
         if (next.isVar()) {
           shieldedVars->insert(next);
         } else {
           todo->loadFromIterator(next.termArgs());
         }
       }
     }
     auto idx = 
       range(0, nVars)
          .find([&](auto i) 
                { return !shieldedVars->contains(diff[i].first); });

    if (idx) {
      // we have a variable unshielded in this unification
      auto num = diff[*idx].second;
      auto& var = diff[*idx].first;
      auto rest = [&]() 
      { return range(0, diff.size())
                .filter([&](auto i) { return i != *idx; })
                .map([&](auto i) { return std::move(diff[i]); }); };

      return AbstractionResult(ifIntTraits(NumTraits{}, 
            // TODO
            [&](auto n) { return num == -1 ? equalIf().unify(constraint(std::move(var), sum(rest())))
                               : num ==  1 ? equalIf().unify(constraint(std::move(var), sum(rest().map([](auto x) { return std::make_pair(std::move(x.first), -std::move(x.second)); }))))
                               :                      equalIf().constr(constraint(numMul(-num, std::move(var)), sum(rest())))
                                                    ; },
            [&](auto n) { return equalIf().unify(constraint(std::move(var), 
                sum(rest().map([&](auto x) { return std::make_pair(std::move(x.first), divOrPanic(n, x.second, -num)); })
                  ))); }
            ));

    } else {
      // all variables are shielded

      if (nVars == 1) {
       auto& var = diff[0].first;
       auto  num = diff[0].second;

       for (auto i : range(nVars, diff.size())) {
         if (uncanellableOccursCheck(au, var.varSpec(), diff[i].first)) {
           return AbstractionResult(NeverEqual{});
         }
       }
     }
     return AbstractionResult(equalIf().constr(toConstr(diff)));
    }
  } 

  // no variables

  Recycled<Stack<UnificationConstraint>> unify;
  Recycled<Stack<UnificationConstraint>> constr;
  auto curF = diff[0].first.functor();
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curPosSummands;
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curNegSummands;
  auto curSum = Numeral(0);  


  auto curSumCanUnify = [&]() -> bool {
      if (curSum != Numeral(0)) {
        return false;

      } else if (curNegSummands->size() == 1) {
        for (auto& s : *curPosSummands) {
          unify->push(UnificationConstraint(
            (*curNegSummands)[0].first,
            std::move(s.first), 
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else if (curPosSummands->size() == 1) {
        for (auto& s : *curNegSummands) {
          unify->push(UnificationConstraint(
            (*curPosSummands)[0].first,
            std::move(s.first),
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else {
        ASS(curPosSummands->size() + curNegSummands->size() >= 3)
        constr->push(UnificationConstraint(
              sum(arrayIter(*curPosSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), x.second); })),
              sum(arrayIter(*curNegSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })),
              TermSpec(sig.sort(), 0)));
        return true;
      }
  };

  for (auto& x : diff) {
    auto f = au.subs().derefBound(x.first).functor();
    if (f != curF) {
      if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
      curF = f;
      curSum = Numeral(0);
      curPosSummands->reset();
      curNegSummands->reset();
    }
    curSum += x.second;
    (x.second.isPositive() ? curPosSummands : curNegSummands)->push(std::move(x));
  }
  if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
  return AbstractionResult(equalIf().unify(std::move(unify)).constr(std::move(constr)));
}